

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void __thiscall
QGraphicsAnchorLayoutPrivate::identifyNonFloatItems_helper
          (QGraphicsAnchorLayoutPrivate *this,AnchorData *ad,
          QSet<QGraphicsLayoutItem_*> *nonFloatingItemsIdentifiedSoFar)

{
  long lVar1;
  qreal qVar2;
  QGraphicsLayoutItem *pQVar3;
  byte bVar4;
  long lVar5;
  long in_FS_OFFSET;
  QGraphicsLayoutItem *copy;
  QHashDummyValue local_39;
  QGraphicsLayoutItem *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  for (; bVar4 = ad->field_0x78 & 3, bVar4 == 2;
      ad = (AnchorData *)ad[1].super_QSimplexVariable.result) {
    identifyNonFloatItems_helper
              (this,(AnchorData *)ad[1]._vptr_AnchorData,nonFloatingItemsIdentifiedSoFar);
  }
  if (bVar4 != 3) {
    if (bVar4 == 1) {
      lVar1 = *(long *)&ad[1].super_QSimplexVariable.index;
      if (lVar1 != 0) {
        qVar2 = ad[1].super_QSimplexVariable.result;
        lVar5 = 0;
        do {
          identifyNonFloatItems_helper
                    (this,*(AnchorData **)((long)qVar2 + lVar5),nonFloatingItemsIdentifiedSoFar);
          lVar5 = lVar5 + 8;
        } while (lVar1 << 3 != lVar5);
      }
    }
    else {
      pQVar3 = ad->item;
      if ((pQVar3 != (QGraphicsLayoutItem *)0x0) &&
         (pQVar3 != (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr)) {
        local_38 = pQVar3;
        QHash<QGraphicsLayoutItem*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QGraphicsLayoutItem*,QHashDummyValue> *)nonFloatingItemsIdentifiedSoFar,
                   &local_38,&local_39);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::identifyNonFloatItems_helper(const AnchorData *ad, QSet<QGraphicsLayoutItem *> *nonFloatingItemsIdentifiedSoFar)
{
    Q_Q(QGraphicsAnchorLayout);

    switch(ad->type) {
    case AnchorData::Normal:
        if (ad->item && ad->item != q)
            nonFloatingItemsIdentifiedSoFar->insert(ad->item);
        break;
    case AnchorData::Sequential:
        for (const AnchorData *d : static_cast<const SequentialAnchorData *>(ad)->m_edges)
            identifyNonFloatItems_helper(d, nonFloatingItemsIdentifiedSoFar);
        break;
    case AnchorData::Parallel:
        identifyNonFloatItems_helper(static_cast<const ParallelAnchorData *>(ad)->firstEdge, nonFloatingItemsIdentifiedSoFar);
        identifyNonFloatItems_helper(static_cast<const ParallelAnchorData *>(ad)->secondEdge, nonFloatingItemsIdentifiedSoFar);
        break;
    }
}